

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void ft_glyphslot_preset_bitmap(FT_GlyphSlot slot,FT_Render_Mode mode,FT_Vector *origin)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong local_90;
  FT_Pos pitch;
  FT_Pos height;
  FT_Pos width;
  FT_Pos y_top;
  FT_Pos x_left;
  FT_Pos y_shift;
  FT_Pos x_shift;
  FT_BBox cbox;
  FT_Pixel_Mode pixel_mode;
  FT_Bitmap *bitmap;
  FT_Outline *outline;
  FT_Vector *origin_local;
  FT_Render_Mode mode_local;
  FT_GlyphSlot slot_local;
  
  y_shift = 0;
  x_left = 0;
  if ((slot->internal != (FT_Slot_Internal)0x0) && ((slot->internal->flags & 1) != 0)) {
    return;
  }
  if (origin != (FT_Vector *)0x0) {
    y_shift = origin->x;
    x_left = origin->y;
  }
  FT_Outline_Get_CBox(&slot->outline,(FT_BBox *)&x_shift);
  x_shift = x_shift + y_shift;
  cbox.xMin = cbox.xMin + x_left;
  cbox.yMin = cbox.yMin + y_shift;
  cbox.xMax = cbox.xMax + x_left;
  switch(mode) {
  case FT_RENDER_MODE_NORMAL:
  case FT_RENDER_MODE_LIGHT:
  default:
    cbox.yMax._4_4_ = 2;
    break;
  case FT_RENDER_MODE_MONO:
    cbox.yMax._4_4_ = 1;
    if (cbox.yMin - x_shift < 0x40) {
      uVar2 = cbox.yMin + 0x3f;
    }
    else {
      x_shift = x_shift + 0x20;
      uVar2 = cbox.yMin + 0x20;
    }
    uVar1 = x_shift;
    if (cbox.xMax - cbox.xMin < 0x40) {
      uVar3 = cbox.xMax + 0x3f;
    }
    else {
      cbox.xMin = cbox.xMin + 0x20;
      uVar3 = cbox.xMax + 0x20;
    }
    goto LAB_001422d2;
  case FT_RENDER_MODE_LCD:
    cbox.yMax._4_4_ = 5;
    ft_lcd_padding(&x_shift,&cbox.yMin,slot);
    break;
  case FT_RENDER_MODE_LCD_V:
    cbox.yMax._4_4_ = 6;
    ft_lcd_padding(&cbox.xMin,&cbox.xMax,slot);
  }
  uVar2 = cbox.yMin + 0x3f;
  uVar3 = cbox.xMax + 0x3f;
  uVar1 = x_shift;
LAB_001422d2:
  cbox.xMax = uVar3 & 0xffffffffffffffc0;
  cbox.yMin = uVar2 & 0xffffffffffffffc0;
  cbox.xMin = cbox.xMin & 0xffffffffffffffc0;
  x_shift = uVar1 & 0xffffffffffffffc0;
  height = (ulong)(cbox.yMin - x_shift) >> 6;
  pitch._0_4_ = (uint)((ulong)(cbox.xMax - cbox.xMin) >> 6);
  switch(cbox.yMax._4_4_) {
  case 1:
    local_90 = ((long)(height + 0xfU) >> 4) << 1;
    break;
  case 5:
    height = height * 3;
    local_90 = height + 3U & 0xfffffffffffffffc;
    break;
  case 6:
    pitch._0_4_ = (uint)pitch * 3;
  case 2:
  default:
    local_90 = height;
  }
  slot->bitmap_left = (FT_Int)((long)uVar1 >> 6);
  slot->bitmap_top = (FT_Int)((long)uVar3 >> 6);
  (slot->bitmap).pixel_mode = (uchar)cbox.yMax._4_4_;
  (slot->bitmap).num_grays = 0x100;
  (slot->bitmap).width = (uint)height;
  (slot->bitmap).rows = (uint)pitch;
  (slot->bitmap).pitch = (int)local_90;
  return;
}

Assistant:

FT_BASE_DEF( void )
  ft_glyphslot_preset_bitmap( FT_GlyphSlot      slot,
                              FT_Render_Mode    mode,
                              const FT_Vector*  origin )
  {
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;

    FT_Pixel_Mode  pixel_mode;

    FT_BBox  cbox;
    FT_Pos   x_shift = 0;
    FT_Pos   y_shift = 0;
    FT_Pos   x_left, y_top;
    FT_Pos   width, height, pitch;


    if ( slot->internal && ( slot->internal->flags & FT_GLYPH_OWN_BITMAP ) )
      return;

    if ( origin )
    {
      x_shift = origin->x;
      y_shift = origin->y;
    }

    /* compute the control box, and grid-fit it, */
    /* taking into account the origin shift      */
    FT_Outline_Get_CBox( outline, &cbox );

    cbox.xMin += x_shift;
    cbox.yMin += y_shift;
    cbox.xMax += x_shift;
    cbox.yMax += y_shift;

    switch ( mode )
    {
    case FT_RENDER_MODE_MONO:
      pixel_mode = FT_PIXEL_MODE_MONO;
#if 1
      /* undocumented but confirmed: bbox values get rounded    */
      /* unless the rounded box can collapse for a narrow glyph */
      if ( cbox.xMax - cbox.xMin < 64 )
      {
        cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
        cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      }
      else
      {
        cbox.xMin = FT_PIX_ROUND_LONG( cbox.xMin );
        cbox.xMax = FT_PIX_ROUND_LONG( cbox.xMax );
      }

      if ( cbox.yMax - cbox.yMin < 64 )
      {
        cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
        cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
      }
      else
      {
        cbox.yMin = FT_PIX_ROUND_LONG( cbox.yMin );
        cbox.yMax = FT_PIX_ROUND_LONG( cbox.yMax );
      }
#else
      cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
      cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
      cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
#endif
      break;

    case FT_RENDER_MODE_LCD:
      pixel_mode = FT_PIXEL_MODE_LCD;
      ft_lcd_padding( &cbox.xMin, &cbox.xMax, slot );
      goto Round;

    case FT_RENDER_MODE_LCD_V:
      pixel_mode = FT_PIXEL_MODE_LCD_V;
      ft_lcd_padding( &cbox.yMin, &cbox.yMax, slot );
      goto Round;

    case FT_RENDER_MODE_NORMAL:
    case FT_RENDER_MODE_LIGHT:
    default:
      pixel_mode = FT_PIXEL_MODE_GRAY;
    Round:
      cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
      cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
      cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
    }

    x_shift = SUB_LONG( x_shift, cbox.xMin );
    y_shift = SUB_LONG( y_shift, cbox.yMin );

    x_left = cbox.xMin >> 6;
    y_top  = cbox.yMax >> 6;

    width  = ( (FT_ULong)cbox.xMax - (FT_ULong)cbox.xMin ) >> 6;
    height = ( (FT_ULong)cbox.yMax - (FT_ULong)cbox.yMin ) >> 6;

    switch ( pixel_mode )
    {
    case FT_PIXEL_MODE_MONO:
      pitch = ( ( width + 15 ) >> 4 ) << 1;
      break;

    case FT_PIXEL_MODE_LCD:
      width *= 3;
      pitch  = FT_PAD_CEIL( width, 4 );
      break;

    case FT_PIXEL_MODE_LCD_V:
      height *= 3;
      /* fall through */

    case FT_PIXEL_MODE_GRAY:
    default:
      pitch = width;
    }

    slot->bitmap_left = (FT_Int)x_left;
    slot->bitmap_top  = (FT_Int)y_top;

    bitmap->pixel_mode = (unsigned char)pixel_mode;
    bitmap->num_grays  = 256;
    bitmap->width      = (unsigned int)width;
    bitmap->rows       = (unsigned int)height;
    bitmap->pitch      = pitch;
  }